

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void CMU462::DynamicScene::drawSemisphere(GLdouble radius,GLint slices,GLint stacks)

{
  undefined8 uVar1;
  
  uVar1 = gluNewQuadric();
  glEnable(0xb90);
  glStencilFunc(0x207,1,0xff);
  glStencilOp(0x1e00,0x1e00,0x1e01);
  glStencilMask(0xff);
  glDepthMask(0);
  glColorMask(0,0,0,0);
  glClear(0x400);
  glPushMatrix();
  glTranslatef(0,(float)(radius * 0.5),0);
  glScalef((float)radius,(float)(radius * 0.5),(float)radius);
  drawCube();
  glPopMatrix();
  glStencilFunc(0x202,1,0xff);
  glStencilMask(0);
  glDepthMask(1);
  glColorMask(1,1,1,1);
  gluSphere(radius,uVar1,slices,stacks);
  glDisable(0xb90);
  gluDeleteQuadric(uVar1);
  return;
}

Assistant:

void drawSemisphere(GLdouble radius, GLint slices, GLint stacks)
  {
    GLUquadric* q = gluNewQuadric();
    glEnable(GL_STENCIL_TEST);

    // Draw half cube
    glStencilFunc(GL_ALWAYS, 1, 0xFF); // Set any stencil to 1
    glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE);
    glStencilMask(0xFF); // Write to stencil buffer
    glDepthMask(GL_FALSE); // Don't write to depth buffer
    glColorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE); // Don't write to color buffer
    glClear(GL_STENCIL_BUFFER_BIT); // Clear stencil buffer (0 by default)

    glPushMatrix();
    glTranslatef(0, radius / 2, 0);
    glScalef(radius, radius / 2, radius);
    drawCube();
    glPopMatrix();

    // Draw sphere
    glStencilFunc(GL_EQUAL, 1, 0xFF); // Pass test if stencil value is 1
    glStencilMask(0x00); // Don't write anything to stencil buffer
    glDepthMask(GL_TRUE); // Write to depth buffer
    glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE); // Write to color buffer
    gluSphere(q, radius, slices, stacks);

    glDisable(GL_STENCIL_TEST);
    gluDeleteQuadric(q);
  }